

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-logging.cc
# Opt level: O0

Result __thiscall
wabt::BinaryReaderLogging::OnImport
          (BinaryReaderLogging *this,Index index,ExternalKind kind,string_view module_name,
          string_view field_name)

{
  Stream *this_00;
  Enum EVar1;
  char *pcVar2;
  size_type sVar3;
  const_pointer pvVar4;
  size_type sVar5;
  const_pointer pvVar6;
  undefined8 in_stack_ffffffffffffff58;
  undefined4 uVar7;
  ExternalKind kind_local;
  Index index_local;
  BinaryReaderLogging *this_local;
  string_view module_name_local;
  
  uVar7 = (undefined4)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  module_name_local._M_len = (size_t)module_name._M_str;
  this_local = (BinaryReaderLogging *)module_name._M_len;
  WriteIndent(this);
  this_00 = this->stream_;
  pcVar2 = GetKindName(kind);
  sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::length
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::data
                     ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::length(&field_name);
  pvVar6 = std::basic_string_view<char,_std::char_traits<char>_>::data(&field_name);
  Stream::Writef(this_00,"OnImport(index: %u, kind: %s, module: \"%.*s\", field: \"%.*s\")\n",
                 (ulong)index,pcVar2,sVar3 & 0xffffffff,pvVar4,CONCAT44(uVar7,(int)sVar5),pvVar6);
  EVar1 = (*this->reader_->_vptr_BinaryReaderDelegate[0x11])
                    (this->reader_,(ulong)index,(ulong)kind,this_local,module_name_local._M_len,
                     field_name._M_str,field_name._M_len,field_name._M_str);
  return (Result)EVar1;
}

Assistant:

Result BinaryReaderLogging::OnImport(Index index,
                                     ExternalKind kind,
                                     std::string_view module_name,
                                     std::string_view field_name) {
  LOGF("OnImport(index: %" PRIindex ", kind: %s, module: \"" PRIstringview
       "\", field: \"" PRIstringview "\")\n",
       index, GetKindName(kind), WABT_PRINTF_STRING_VIEW_ARG(module_name),
       WABT_PRINTF_STRING_VIEW_ARG(field_name));
  return reader_->OnImport(index, kind, module_name, field_name);
}